

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFieldInfo.cpp
# Opt level: O1

string * __thiscall
ser::DataFieldInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,DataFieldInfo *this)

{
  ostream *poVar1;
  ostringstream strm;
  string local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(this->name_)._M_dataplus._M_p,
                      (this->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->iSize_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"x",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->jSize_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"x",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->kSize_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"x",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->lSize_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
  MetainfoSet::ToString_abi_cxx11_(&local_1b0,&this->metainfo_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string DataFieldInfo::ToString() const
{
    std::ostringstream strm;
    strm << name_ << " ("
         << iSize_ << "x" << jSize_ << "x" << kSize_ << "x" << lSize_
         << ") " << metainfo_.ToString();
    return strm.str();
}